

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O3

void BrotliStoreUncompressedMetaBlock
               (int is_final_block,uint8_t *input,size_t position,size_t mask,size_t len,
               size_t *storage_ix,uint8_t *storage)

{
  uint8_t *puVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __n;
  
  uVar3 = position & mask;
  uVar6 = *storage_ix;
  *(ulong *)(storage + (uVar6 >> 3)) = (ulong)storage[uVar6 >> 3];
  if ((len == 1) || (uVar4 = (int)len - 1, uVar4 < 0x8000)) {
    uVar5 = 4;
  }
  else {
    uVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar5 = (ulong)((uVar2 ^ 0xffffffe0) + 0x24 >> 2);
  }
  uVar7 = uVar6 + 1 >> 3;
  *(ulong *)(storage + uVar7) = uVar5 - 4 << ((byte)(uVar6 + 1) & 7) | (ulong)storage[uVar7];
  uVar7 = uVar6 + 3 >> 3;
  *(size_t *)(storage + uVar7) = len - 1 << ((byte)(uVar6 + 3) & 7) | (ulong)storage[uVar7];
  uVar6 = uVar6 + uVar5 * 4 + 3;
  *(ulong *)(storage + (uVar6 >> 3)) = (ulong)storage[uVar6 >> 3] | 1L << ((byte)uVar6 & 7);
  uVar4 = (int)uVar6 + 8;
  uVar6 = (ulong)(uVar4 & 0xfffffff8);
  uVar5 = (ulong)(uVar4 >> 3);
  storage[uVar5] = '\0';
  if (mask + 1 < uVar3 + len) {
    __n = (mask + 1) - uVar3;
    memcpy(storage + uVar5,input + uVar3,__n);
    uVar6 = uVar6 + __n * 8;
    len = len - __n;
    uVar5 = uVar6 >> 3;
    uVar3 = 0;
  }
  memcpy(storage + uVar5,input + uVar3,len);
  uVar6 = len * 8 + uVar6;
  *storage_ix = uVar6;
  storage[uVar6 >> 3] = '\0';
  if (is_final_block != 0) {
    puVar1 = storage + (uVar6 >> 3);
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    uVar3 = uVar6 + 1 >> 3;
    *(ulong *)(storage + uVar3) = (ulong)storage[uVar3] | 1L << ((byte)(uVar6 + 1) & 7);
    *storage_ix = (ulong)((int)uVar6 + 8);
    storage[(int)uVar6 + 9U >> 3] = '\0';
  }
  return;
}

Assistant:

void BrotliStoreUncompressedMetaBlock(BROTLI_BOOL is_final_block,
                                      const uint8_t* BROTLI_RESTRICT input,
                                      size_t position, size_t mask,
                                      size_t len,
                                      size_t* BROTLI_RESTRICT storage_ix,
                                      uint8_t* BROTLI_RESTRICT storage) {
  size_t masked_pos = position & mask;
  BrotliStoreUncompressedMetaBlockHeader(len, storage_ix, storage);
  JumpToByteBoundary(storage_ix, storage);

  if (masked_pos + len > mask + 1) {
    size_t len1 = mask + 1 - masked_pos;
    memcpy(&storage[*storage_ix >> 3], &input[masked_pos], len1);
    *storage_ix += len1 << 3;
    len -= len1;
    masked_pos = 0;
  }
  memcpy(&storage[*storage_ix >> 3], &input[masked_pos], len);
  *storage_ix += len << 3;

  /* We need to clear the next 4 bytes to continue to be
     compatible with BrotliWriteBits. */
  BrotliWriteBitsPrepareStorage(*storage_ix, storage);

  /* Since the uncompressed block itself may not be the final block, add an
     empty one after this. */
  if (is_final_block) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    JumpToByteBoundary(storage_ix, storage);
  }
}